

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O0

int rlbot::Interface::SetGameState(GameState state)

{
  code *pcVar1;
  Offset<rlbot::flat::DesiredGameState> root;
  uoffset_t uVar2;
  int iVar3;
  size_t buffer_minalign;
  uint8_t *puVar4;
  undefined1 local_68 [8];
  FlatBufferBuilder builder;
  
  buffer_minalign = flatbuffers::AlignOf<unsigned_long>();
  flatbuffers::FlatBufferBuilder::FlatBufferBuilder
            ((FlatBufferBuilder *)local_68,1000,(Allocator *)0x0,false,buffer_minalign);
  root = GameState::BuildFlatBuffer((GameState *)&stack0x00000008,(FlatBufferBuilder *)local_68);
  flatbuffers::FlatBufferBuilder::Finish<rlbot::flat::DesiredGameState>
            ((FlatBufferBuilder *)local_68,root,(char *)0x0);
  pcVar1 = _setGameState;
  puVar4 = flatbuffers::FlatBufferBuilder::GetBufferPointer((FlatBufferBuilder *)local_68);
  uVar2 = flatbuffers::FlatBufferBuilder::GetSize((FlatBufferBuilder *)local_68);
  iVar3 = (*pcVar1)(puVar4,uVar2);
  flatbuffers::FlatBufferBuilder::~FlatBufferBuilder((FlatBufferBuilder *)local_68);
  return iVar3;
}

Assistant:

int Interface::SetGameState(GameState state) {
  flatbuffers::FlatBufferBuilder builder(1000);
  builder.Finish(state.BuildFlatBuffer(builder));

  return _setGameState(builder.GetBufferPointer(), builder.GetSize());
}